

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

Var Js::TypedArrayBase::EntryGetterLength(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ArrayBufferBase *pAVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var pvVar6;
  TypedArrayBase *pTVar7;
  undefined1 *puVar8;
  int32 hCode;
  int in_stack_00000010;
  CallInfo local_30;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_30 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,1099,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00bf5f2f;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_30,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_30 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x44e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00bf5f2f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  if ((callInfo_local._0_4_ & 0xffffff) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    bVar4 = VarIs<Js::TypedArrayBase>(pvVar6);
    if (bVar4) {
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      pTVar7 = UnsafeVarTo<Js::TypedArrayBase>(pvVar6);
      pAVar2 = (pTVar7->super_ArrayBufferParent).arrayBuffer.ptr;
      if (pAVar2 != (ArrayBufferBase *)0x0) {
        if (pAVar2->isDetached == false) {
          puVar8 = (undefined1 *)
                   JavascriptNumber::ToVar
                             ((pTVar7->super_ArrayBufferParent).super_ArrayObject.length,pSVar1);
        }
        else {
          puVar8 = &DAT_1000000000000;
        }
        return puVar8;
      }
      hCode = -0x7ff5ea1c;
      goto LAB_00bf5f39;
    }
  }
  hCode = -0x7ff5ec25;
LAB_00bf5f39:
  JavascriptError::ThrowTypeError(pSVar1,hCode,(PCWSTR)0x0);
}

Assistant:

Var TypedArrayBase::EntryGetterLength(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<TypedArrayBase>(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedTypedArray);
        }

        TypedArrayBase* typedArray = UnsafeVarTo<TypedArrayBase>(args[0]);
        ArrayBufferBase* arrayBuffer = typedArray->GetArrayBuffer();

        if (arrayBuffer == nullptr)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedArrayBufferObject);
        }
        else if (arrayBuffer->IsDetached())
        {
            return TaggedInt::ToVarUnchecked(0);
        }

        return JavascriptNumber::ToVar(typedArray->GetLength(), scriptContext);
    }